

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

iterator __thiscall
VideoHppGenerator::addImplicitlyRequiredTypes
          (VideoHppGenerator *this,iterator typeIt,ExtensionData *extensionData,iterator reqIt)

{
  _Base_ptr p_Var1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator typeIt_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ulong uVar7;
  iterator iVar8;
  const_iterator __it;
  _Base_ptr __k;
  const_iterator __it_00;
  MemberData *member;
  _Base_ptr p_Var9;
  long lVar10;
  
  __k = typeIt._M_node + 1;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,__k);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("structIt != m_structs.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x6a,
                  "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
                 );
  }
  p_Var9 = *(_Base_ptr *)(iVar5._M_node + 2);
  p_Var1 = iVar5._M_node[2]._M_parent;
  if (p_Var9 != p_Var1) {
    do {
      typeIt_00 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                  ::find(&(this->m_types)._M_t,(key_type *)(p_Var9 + 1));
      if (((_Rb_tree_header *)typeIt_00._M_node !=
           &(this->m_types)._M_t._M_impl.super__Rb_tree_header) &&
         (typeIt_00._M_node[2]._M_color == 9)) {
        reqIt = addImplicitlyRequiredTypes(this,(iterator)typeIt_00._M_node,extensionData,reqIt);
      }
      p_Var9 = p_Var9 + 6;
    } while (p_Var9 != p_Var1);
  }
  if (typeIt._M_node[3]._M_left != (_Base_ptr)0x0) {
    lVar10 = *(long *)(typeIt._M_node + 3);
    __n = *(size_t *)(lVar10 + 0x28);
    if (__n == (extensionData->name)._M_string_length) {
      if (__n == 0) {
        return (iterator)reqIt._M_current;
      }
      iVar4 = bcmp(*(void **)(lVar10 + 0x20),(extensionData->name)._M_dataplus._M_p,__n);
      if (iVar4 == 0) {
        return (iterator)reqIt._M_current;
      }
    }
    if (__n == (extensionData->depends)._M_string_length) {
      if (__n == 0) {
        return (iterator)reqIt._M_current;
      }
      iVar4 = bcmp(*(void **)(lVar10 + 0x20),(extensionData->depends)._M_dataplus._M_p,__n);
      if (iVar4 == 0) {
        return (iterator)reqIt._M_current;
      }
    }
    __assert_fail("typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) || ( *typeIt->second.requiredBy.begin() == extensionData.depends )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x74,
                  "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
                 );
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((extensionData->requireData).types.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,reqIt._M_current,__k);
  if (_Var6._M_current != reqIt._M_current) {
    return (iterator)reqIt._M_current;
  }
  pbVar2 = (extensionData->requireData).types.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pbVar2 - (long)reqIt._M_current;
  __it_00._M_current = reqIt._M_current;
  if (0 < (long)uVar7 >> 7) {
    __it_00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&((reqIt._M_current)->_M_dataplus)._M_p + (uVar7 & 0xffffffffffffff80));
    lVar10 = ((long)uVar7 >> 7) + 1;
    __it._M_current = reqIt._M_current;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)typeIt._M_node,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__it._M_current);
      _Var6._M_current = __it._M_current;
      if (bVar3) goto LAB_001092f4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)typeIt._M_node,__it._M_current + 1);
      _Var6._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_001092f4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)typeIt._M_node,__it._M_current + 2);
      _Var6._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_001092f4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)typeIt._M_node,__it._M_current + 3);
      _Var6._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_001092f4;
      __it._M_current = __it._M_current + 4;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
    uVar7 = (long)pbVar2 - (long)__it_00._M_current;
  }
  lVar10 = (long)uVar7 >> 5;
  if (lVar10 == 1) {
LAB_001092d3:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)typeIt._M_node,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )__it_00._M_current);
    _Var6._M_current = __it_00._M_current;
    if (!bVar3) {
      _Var6._M_current = pbVar2;
    }
  }
  else if (lVar10 == 2) {
LAB_001092bb:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)typeIt._M_node,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )__it_00._M_current);
    _Var6._M_current = __it_00._M_current;
    if (!bVar3) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_001092d3;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_001092f9;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)typeIt._M_node,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )__it_00._M_current);
    _Var6._M_current = __it_00._M_current;
    if (!bVar3) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_001092bb;
    }
  }
LAB_001092f4:
  if (_Var6._M_current != pbVar2) {
    __assert_fail("std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x77,
                  "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
                 );
  }
LAB_001092f9:
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&typeIt._M_node[2]._M_parent,&extensionData->name);
  iVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&(extensionData->requireData).types,reqIt._M_current,(value_type *)__k);
  return (iterator)(iVar8._M_current + 1);
}

Assistant:

std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes( std::map<std::string, TypeData>::iterator typeIt,
                                                                                  ExtensionData &                           extensionData,
                                                                                  std::vector<std::string>::iterator        reqIt )
{
  auto structIt = m_structs.find( typeIt->first );
  assert( structIt != m_structs.end() );
  for ( auto const & member : structIt->second.members )
  {
    auto memberTypeIt = m_types.find( member.type.type );
    if ( ( memberTypeIt != m_types.end() ) && ( memberTypeIt->second.category == TypeCategory::Struct ) )
    {
      reqIt = addImplicitlyRequiredTypes( memberTypeIt, extensionData, reqIt );
    }
  }
  assert( typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) ||
          ( *typeIt->second.requiredBy.begin() == extensionData.depends ) );
  if ( typeIt->second.requiredBy.empty() && ( std::find( extensionData.requireData.types.begin(), reqIt, typeIt->first ) == reqIt ) )
  {
    assert( std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } ) );
    typeIt->second.requiredBy.insert( extensionData.name );
    reqIt = std::next( extensionData.requireData.types.insert( reqIt, typeIt->first ) );
  }
  return reqIt;
}